

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

bool __thiscall Lib::Stack<Shell::Options::Mode>::find(Stack<Shell::Options::Mode> *this,Mode *el)

{
  bool bVar1;
  Mode MVar2;
  Mode *in_RSI;
  Iterator it;
  Stack<Shell::Options::Mode> *in_stack_ffffffffffffffd8;
  Stack<Shell::Options::Mode> *in_stack_ffffffffffffffe0;
  
  Iterator::Iterator((Iterator *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  do {
    bVar1 = RefIterator::hasNext((RefIterator *)&stack0xffffffffffffffd8);
    if (!bVar1) {
      return false;
    }
    MVar2 = Iterator::next((Iterator *)0xc8b151);
  } while (MVar2 != *in_RSI);
  return true;
}

Assistant:

bool find(const C& el) const
  {
    Iterator it(const_cast<Stack&>(*this));
    while(it.hasNext()) {
      if(it.next()==el) {
	return true;
      }
    }
    return false;
  }